

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_descent_parser.cpp
# Opt level: O0

JsonValue * __thiscall MercuryJson::JSON::_parse_object(JSON *this)

{
  ulong *puVar1;
  ulong uVar2;
  runtime_error *prVar3;
  JsonObject *pJVar4;
  JSON *in_RDI;
  JsonObject *ptr;
  JsonObject *object;
  JsonValue *value;
  char *str;
  char ch;
  size_t idx;
  size_t in_stack_00000168;
  char in_stack_00000177;
  char *in_stack_00000178;
  JSON *in_stack_00000180;
  JsonObject *in_stack_ffffffffffffff78;
  BlockAllocator<MercuryJson::JsonValue> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  BlockAllocator<MercuryJson::JsonValue> *in_stack_ffffffffffffff90;
  JsonObject *local_58;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  JsonValue *local_8;
  
  if (in_RDI->input[*in_RDI->idx_ptr] == '}') {
    puVar1 = in_RDI->idx_ptr;
    in_RDI->idx_ptr = puVar1 + 1;
    if (in_RDI->input_len <= *puVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"text ended prematurely");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_8 = BlockAllocator<MercuryJson::JsonValue>::
              construct<MercuryJson::JsonValue,MercuryJson::JsonObject*>
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    if (in_RDI->input[*in_RDI->idx_ptr] != '\"') {
      _error(in_stack_00000180,in_stack_00000178,in_stack_00000177,in_stack_00000168);
    }
    _parse_str(in_RDI,*in_RDI->idx_ptr);
    puVar1 = in_RDI->idx_ptr;
    in_RDI->idx_ptr = puVar1 + 1;
    if (in_RDI->input_len <= *puVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"text ended prematurely");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar1 = in_RDI->idx_ptr;
    in_RDI->idx_ptr = puVar1 + 1;
    uVar2 = *puVar1;
    if (in_RDI->input_len <= uVar2) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"text ended prematurely");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (in_RDI->input[uVar2] != ':') {
      _error(in_stack_00000180,in_stack_00000178,in_stack_00000177,in_stack_00000168);
    }
    _parse_value((JSON *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    local_58 = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonObject,char*,MercuryJson::JsonValue*>
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          (JsonValue *)in_stack_ffffffffffffff80);
    while( true ) {
      puVar1 = in_RDI->idx_ptr;
      in_RDI->idx_ptr = puVar1 + 1;
      uVar2 = *puVar1;
      if (in_RDI->input_len <= uVar2) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"text ended prematurely");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (in_RDI->input[uVar2] == '}') break;
      if (in_RDI->input[uVar2] != ',') {
        _error(in_stack_00000180,in_stack_00000178,in_stack_00000177,in_stack_00000168);
      }
      if (in_RDI->input[*in_RDI->idx_ptr] != '\"') {
        _error(in_stack_00000180,in_stack_00000178,in_stack_00000177,in_stack_00000168);
      }
      _parse_str(in_RDI,*in_RDI->idx_ptr);
      puVar1 = in_RDI->idx_ptr;
      in_RDI->idx_ptr = puVar1 + 1;
      if (in_RDI->input_len <= *puVar1) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"text ended prematurely");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar1 = in_RDI->idx_ptr;
      in_RDI->idx_ptr = puVar1 + 1;
      uVar2 = *puVar1;
      if (in_RDI->input_len <= uVar2) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"text ended prematurely");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (in_RDI->input[uVar2] != ':') {
        _error(in_stack_00000180,in_stack_00000178,in_stack_00000177,in_stack_00000168);
      }
      _parse_value((JSON *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      pJVar4 = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonObject,char*,MercuryJson::JsonValue*>
                         (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                          (JsonValue *)in_stack_ffffffffffffff80);
      local_58->next = pJVar4;
      local_58 = pJVar4;
    }
    local_8 = BlockAllocator<MercuryJson::JsonValue>::
              construct<MercuryJson::JsonValue,MercuryJson::JsonObject*>
                        (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  return local_8;
}

Assistant:

JsonValue *JSON::_parse_object() {
        size_t idx;
        char ch;
        peek_char();
        if (ch == '}') {
            next_char();
            return allocator.construct(static_cast<JsonObject *>(nullptr));
        }

        expect('"');
        char *str = _parse_str(idx);
        next_char();
        next_char();
        expect(':');
        JsonValue *value = _parse_value();
        auto *object = allocator.construct<JsonObject>(str, value), *ptr = object;
        while (true) {
            next_char();
            if (ch == '}') break;
            expect(',');
            peek_char();
            expect('"');
            str = _parse_str(idx);
            next_char();
            next_char();
            expect(':');
            value = _parse_value();
            ptr = ptr->next = allocator.construct<JsonObject>(str, value);
        }
        return allocator.construct(object);
    }